

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O2

uint8_t pull_u8(uchar **cursor,size_t *max)

{
  uint8_t v;
  
  pull_bytes(&v,1,cursor,max);
  return v;
}

Assistant:

uint8_t pull_u8(const unsigned char **cursor, size_t *max)
{
    uint8_t v;
    pull_bytes(&v, sizeof(v), cursor, max);
    return v;
}